

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O2

void vector_gautbl_eval_logs3
               (vector_gautbl_t *gautbl,int32 offset,int32 count,float32 *x,int32 *score,
               logmath_t *logmath)

{
  double dVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  float64 __x;
  double dVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar13;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  __x = logmath_get_base(logmath);
  dVar6 = log((double)__x);
  dVar6 = 1.0 / dVar6;
  uVar2 = (ulong)(uint)gautbl->veclen;
  if (gautbl->veclen < 1) {
    uVar2 = 0;
  }
  for (lVar4 = (long)offset; lVar4 < count + offset + -1; lVar4 = lVar4 + 2) {
    dVar7 = (double)(float)*(undefined8 *)(gautbl->lrd + lVar4);
    dVar1 = (double)(float)((ulong)*(undefined8 *)(gautbl->lrd + lVar4) >> 0x20);
    uVar5 = 0;
    while( true ) {
      if (uVar2 == uVar5) break;
      dVar10 = (double)((float)x[uVar5] - (float)gautbl->mean[lVar4][uVar5]);
      dVar13 = (double)((float)x[uVar5] - (float)gautbl->mean[lVar4 + 1][uVar5]);
      dVar7 = dVar7 - dVar10 * dVar10 * (double)(float)gautbl->var[lVar4][uVar5];
      dVar1 = dVar1 - dVar13 * dVar13 * (double)(float)gautbl->var[lVar4 + 1][uVar5];
      uVar5 = uVar5 + 1;
    }
    auVar11._8_8_ = gautbl->distfloor;
    auVar11._0_8_ = gautbl->distfloor;
    auVar12._8_4_ = SUB84(dVar1,0);
    auVar12._0_8_ = dVar7;
    auVar12._12_4_ = (int)((ulong)dVar1 >> 0x20);
    auVar12 = maxpd(auVar11,auVar12);
    *(ulong *)(score + lVar4) = CONCAT44((int)(auVar12._8_8_ * dVar6),(int)(auVar12._0_8_ * dVar6));
  }
  iVar3 = (int)lVar4;
  if (iVar3 < count + offset) {
    dVar7 = (double)(float)gautbl->lrd[iVar3];
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      dVar1 = (double)((float)x[uVar5] - (float)gautbl->mean[iVar3][uVar5]);
      dVar7 = dVar7 - dVar1 * dVar1 * (double)(float)gautbl->var[iVar3][uVar5];
    }
    dVar1 = (double)gautbl->distfloor;
    uVar8 = SUB84(dVar1,0);
    uVar9 = (undefined4)((ulong)dVar1 >> 0x20);
    if (dVar1 <= dVar7) {
      uVar8 = SUB84(dVar7,0);
      uVar9 = (undefined4)((ulong)dVar7 >> 0x20);
    }
    score[iVar3] = (int)(dVar6 * (double)CONCAT44(uVar9,uVar8));
  }
  return;
}

Assistant:

void
vector_gautbl_eval_logs3(vector_gautbl_t * gautbl,
                         int32 offset,
                         int32 count, float32 * x, int32 * score, logmath_t * logmath)
{
    int32 i, r;
    float64 f;
    int32 end, veclen;
    float32 *m1, *m2, *v1, *v2;
    float64 dval1, dval2, diff1, diff2;

    f = 1.0 / log(logmath_get_base(logmath));

    /* Interleave evaluation of two vectors at a time for speed on pipelined machines */
    end = offset + count;
    veclen = gautbl->veclen;

    for (r = offset; r < end - 1; r += 2) {
        m1 = gautbl->mean[r];
        m2 = gautbl->mean[r + 1];
        v1 = gautbl->var[r];
        v2 = gautbl->var[r + 1];
        dval1 = gautbl->lrd[r];
        dval2 = gautbl->lrd[r + 1];

        for (i = 0; i < veclen; i++) {
            diff1 = x[i] - m1[i];
            dval1 -= diff1 * diff1 * v1[i];
            diff2 = x[i] - m2[i];
            dval2 -= diff2 * diff2 * v2[i];
        }

        if (dval1 < gautbl->distfloor)
            dval1 = gautbl->distfloor;
        if (dval2 < gautbl->distfloor)
            dval2 = gautbl->distfloor;

        score[r] = (int32) (f * dval1);
        score[r + 1] = (int32) (f * dval2);
    }

    if (r < end) {
        m1 = gautbl->mean[r];
        v1 = gautbl->var[r];
        dval1 = gautbl->lrd[r];

        for (i = 0; i < veclen; i++) {
            diff1 = x[i] - m1[i];
            dval1 -= diff1 * diff1 * v1[i];
        }

        if (dval1 < gautbl->distfloor)
            dval1 = gautbl->distfloor;

        score[r] = (int32) (f * dval1);
    }
}